

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

ostream * operator<<(ostream *o,span<unsigned_short> *d)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  char local_29;
  
  if (1 < d->_len) {
    uVar3 = d->_len & 0xfffffffffffffffe;
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    if (uVar3 != 2) {
      uVar2 = 2;
      do {
        local_29 = ' ';
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(o,&local_29,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        uVar2 = uVar2 + 2;
      } while (uVar3 != uVar2);
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}